

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

void mzd_to_bitstream(bitstream_t *bs,mzd_local_t *v,size_t width,size_t size)

{
  ulong in_RCX;
  long in_RDX;
  long in_RSI;
  bitstream_t *in_RDI;
  size_t bits;
  uint64_t *d;
  ulong local_30;
  uint64_t *local_28;
  
  local_28 = (uint64_t *)(in_RSI + (in_RDX + -1) * 8);
  for (local_30 = in_RCX; 0x3f < local_30; local_30 = local_30 - 0x40) {
    bitstream_put_bits(in_RDI,*local_28,0x40);
    local_28 = local_28 + -1;
  }
  if (local_30 != 0) {
    bitstream_put_bits(in_RDI,*local_28 >> (0x40U - (char)local_30 & 0x3f),(uint)local_30);
  }
  return;
}

Assistant:

static inline void mzd_to_bitstream(bitstream_t* bs, const mzd_local_t* v, const size_t width,
                                    const size_t size) {
  const uint64_t* d = &CONST_BLOCK(v, 0)->w64[width - 1];
  size_t bits       = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    bitstream_put_bits(bs, *d, sizeof(uint64_t) * 8);
  }
  if (bits) {
    bitstream_put_bits(bs, *d >> (sizeof(uint64_t) * 8 - bits), bits);
  }
}